

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseManager::SetDefaultDatabase
          (DatabaseManager *this,ClientContext *context,string *new_value)

{
  AttachedDatabase *pAVar1;
  InternalException *pIVar2;
  allocator local_61;
  optional_ptr<duckdb::AttachedDatabase,_true> db_entry;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  db_entry = GetDatabase(this,context,new_value);
  if (db_entry.ptr == (AttachedDatabase *)0x0) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_58,"Database \"%s\" not found",&local_61);
    ::std::__cxx11::string::string((string *)&local_38,(string *)new_value);
    InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_58,&local_38);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pAVar1 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&db_entry);
  if (pAVar1->type != TEMP_DATABASE) {
    pAVar1 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&db_entry);
    if (pAVar1->type != SYSTEM_DATABASE) {
      ::std::__cxx11::string::_M_assign((string *)&this->default_database);
      return;
    }
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"Cannot set the default database to a system database",&local_61)
    ;
    InternalException::InternalException(pIVar2,(string *)&local_58);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"Cannot set the default database to a temporary database",&local_61
            );
  InternalException::InternalException(pIVar2,(string *)&local_58);
  __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseManager::SetDefaultDatabase(ClientContext &context, const string &new_value) {
	auto db_entry = GetDatabase(context, new_value);

	if (!db_entry) {
		throw InternalException("Database \"%s\" not found", new_value);
	} else if (db_entry->IsTemporary()) {
		throw InternalException("Cannot set the default database to a temporary database");
	} else if (db_entry->IsSystem()) {
		throw InternalException("Cannot set the default database to a system database");
	}

	default_database = new_value;
}